

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O1

void filename_check(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *names,char *aname)

{
  int iVar1;
  invalid_argument *this;
  ulong uVar2;
  string bname;
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,aname,&local_41);
  if ((names->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (names->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((string *)local_40);
      if (iVar1 == 0) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (this,"input and output file names cannot be the same");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(names->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(names->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void
filename_check (vector<string> names, const char* aname)
{
    string bname (aname);
    for (size_t i = 0; i < names.size (); i++)
        if (bname.compare (names[i]) == 0)
            throw invalid_argument (
                "input and output file names cannot be the same");
}